

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall
t_c_glib_generator::generate_consts
          (t_c_glib_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  bool bVar1;
  ostream *poVar2;
  reference pptVar3;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  t_const_value *local_f0;
  t_const_value *value;
  t_type *type;
  undefined1 local_c0 [8];
  string name_lc;
  string local_90;
  undefined1 local_70 [8];
  string name_uc;
  string name;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_20;
  iterator c_iter;
  vector<t_const_*,_std::allocator<t_const_*>_> *consts_local;
  t_c_glib_generator *this_local;
  
  c_iter._M_current = (t_const **)consts;
  poVar2 = std::operator<<((ostream *)&this->f_types_,"/* constants */");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)&this->f_types_impl_,"/* constants */");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
  __normal_iterator(&local_20);
  local_20._M_current =
       (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(consts);
  while( true ) {
    name.field_2._8_8_ = std::vector<t_const_*,_std::allocator<t_const_*>_>::end(consts);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                        *)((long)&name.field_2 + 8));
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
              operator*(&local_20);
    t_const::get_name_abi_cxx11_((string *)(name_uc.field_2._M_local_buf + 8),*pptVar3);
    std::__cxx11::string::string((string *)&local_90,(string *)(name_uc.field_2._M_local_buf + 8));
    to_upper_case((string *)local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&type,(string *)(name_uc.field_2._M_local_buf + 8));
    to_lower_case((string *)local_c0,(string *)&type);
    std::__cxx11::string::~string((string *)&type);
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
              operator*(&local_20);
    value = (t_const_value *)t_const::get_type(*pptVar3);
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
              operator*(&local_20);
    local_f0 = t_const::get_value(*pptVar3);
    bVar1 = is_complex_type(this,(t_type *)value);
    if (bVar1) {
      type_name_abi_cxx11_(&local_110,this,(t_type *)value,false,false);
      poVar2 = std::operator<<((ostream *)&this->f_types_,(string *)&local_110);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_130);
      poVar2 = std::operator<<(poVar2,(string *)&this->nspace_lc);
      poVar2 = std::operator<<(poVar2,(string *)local_c0);
      poVar2 = std::operator<<(poVar2,"_constant();");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
    }
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
    poVar2 = std::operator<<((ostream *)&this->f_types_,(string *)&local_150);
    poVar2 = std::operator<<(poVar2,"#define ");
    poVar2 = std::operator<<(poVar2,(string *)&this->nspace_uc);
    poVar2 = std::operator<<(poVar2,(string *)local_70);
    poVar2 = std::operator<<(poVar2," ");
    std::__cxx11::string::string((string *)&local_190,(string *)local_c0);
    constant_value(&local_170,this,&local_190,(t_type *)value,local_f0);
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::string((string *)&local_1b0,(string *)local_c0);
    generate_const_initializer(this,&local_1b0,(t_type *)value,local_f0,true);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(name_uc.field_2._M_local_buf + 8));
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    operator++(&local_20);
  }
  std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_types_impl_,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_c_glib_generator::generate_consts(vector<t_const*> consts) {
  f_types_ << "/* constants */" << endl;
  f_types_impl_ << "/* constants */" << endl;

  vector<t_const*>::iterator c_iter;
  for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
    string name = (*c_iter)->get_name();
    string name_uc = to_upper_case(name);
    string name_lc = to_lower_case(name);
    t_type* type = (*c_iter)->get_type();
    t_const_value* value = (*c_iter)->get_value();

    if (is_complex_type(type)) {
      f_types_ << type_name(type) << indent() << this->nspace_lc << name_lc
               << "_constant();" << endl;
    }

    f_types_ << indent() << "#define " << this->nspace_uc << name_uc << " "
             << constant_value(name_lc, type, value) << endl;

    generate_const_initializer(name_lc, type, value, true);
  }

  f_types_ << endl;
  f_types_impl_ << endl;
}